

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_entt_entity_editor.hpp
# Opt level: O3

ComponentInfo * __thiscall
MM::EntityEditor<entt::entity>::registerComponent<Components::Velocity>
          (EntityEditor<entt::entity> *this,string *name)

{
  ComponentInfo *pCVar1;
  Callback local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object =
       ComponentEditorWidget<Components::Velocity,entt::entity>;
  local_28._M_invoker =
       std::
       _Function_handler<void_(entt::basic_registry<entt::entity>_&,_entt::entity),_void_(*)(entt::basic_registry<entt::entity>_&,_entt::entity)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<void_(entt::basic_registry<entt::entity>_&,_entt::entity),_void_(*)(entt::basic_registry<entt::entity>_&,_entt::entity)>
       ::_M_manager;
  pCVar1 = registerComponent<Components::Velocity>(this,name,&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return pCVar1;
}

Assistant:

ComponentInfo& registerComponent(const std::string& name)
	{
		return registerComponent<Component>(name, ComponentEditorWidget<Component, EntityType>);
	}